

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

int memory_access_size(MemoryRegion_conflict *mr,uint l,hwaddr addr)

{
  uint uVar1;
  uint64_t uVar2;
  uint local_24;
  uint align_size_max;
  uint access_size_max;
  hwaddr addr_local;
  uint l_local;
  MemoryRegion_conflict *mr_local;
  
  local_24 = (mr->ops->valid).max_access_size;
  if (local_24 == 0) {
    local_24 = 4;
  }
  if (((((mr->ops->impl).unaligned & 1U) == 0) && (uVar1 = (uint)addr & -(uint)addr, uVar1 != 0)) &&
     (uVar1 < local_24)) {
    local_24 = uVar1;
  }
  addr_local._4_4_ = l;
  if (local_24 < l) {
    addr_local._4_4_ = local_24;
  }
  uVar2 = pow2floor((ulong)addr_local._4_4_);
  return (int)uVar2;
}

Assistant:

static int memory_access_size(MemoryRegion *mr, unsigned l, hwaddr addr)
{
    unsigned access_size_max = mr->ops->valid.max_access_size;

    /* Regions are assumed to support 1-4 byte accesses unless
       otherwise specified.  */
    if (access_size_max == 0) {
        access_size_max = 4;
    }

    /* Bound the maximum access by the alignment of the address.  */
    if (!mr->ops->impl.unaligned) {
#ifdef _MSC_VER
        unsigned align_size_max = addr & (0ULL - addr);
#else
        unsigned align_size_max = addr & -addr;
#endif
        if (align_size_max != 0 && align_size_max < access_size_max) {
            access_size_max = align_size_max;
        }
    }

    /* Don't attempt accesses larger than the maximum.  */
    if (l > access_size_max) {
        l = access_size_max;
    }
    l = pow2floor(l);

    return l;
}